

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_14d664b::BacktraceData::BacktraceData(BacktraceData *this,string *topSource)

{
  std::__cxx11::string::string((string *)this,(string *)topSource);
  (this->CommandMap)._M_h._M_buckets = &(this->CommandMap)._M_h._M_single_bucket;
  (this->CommandMap)._M_h._M_bucket_count = 1;
  (this->CommandMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->CommandMap)._M_h._M_element_count = 0;
  (this->CommandMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->CommandMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->CommandMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->FileMap)._M_h._M_buckets = &(this->FileMap)._M_h._M_single_bucket;
  (this->FileMap)._M_h._M_bucket_count = 1;
  (this->FileMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->FileMap)._M_h._M_element_count = 0;
  (this->FileMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->FileMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->FileMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->NodeMap)._M_h._M_buckets = &(this->NodeMap)._M_h._M_single_bucket;
  (this->NodeMap)._M_h._M_bucket_count = 1;
  (this->NodeMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->NodeMap)._M_h._M_element_count = 0;
  (this->NodeMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->NodeMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->NodeMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Json::Value::Value(&this->Commands,arrayValue);
  Json::Value::Value(&this->Files,arrayValue);
  Json::Value::Value(&this->Nodes,arrayValue);
  return;
}

Assistant:

BacktraceData::BacktraceData(std::string topSource)
  : TopSource(std::move(topSource))
{
}